

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O2

float fasttanh(float p)

{
  float fVar1;
  float fVar2;
  
  fVar2 = p * -2.0 * 1.442695;
  fVar1 = -126.0;
  if (-126.0 <= fVar2) {
    fVar1 = fVar2;
  }
  fVar2 = (fVar1 - (float)(int)fVar1) + (float)(-(uint)(fVar2 < 0.0) & 0x3f800000);
  return 2.0 / ((float)(long)((fVar2 * -1.4901291 +
                              27.728024 / (4.8425255 - fVar2) + fVar1 + 121.274055) * 8388608.0) +
               1.0) + -1.0;
}

Assistant:

static inline float fasttanh(float p) { return -1.0f + 2.0f / (1.0f + fastexp(-2.0f * p)); }